

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,size_t stackCapacity
                 ,CrtAllocator *stackAllocator)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  CrtAllocator *stackAllocator_local;
  size_t stackCapacity_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_local;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_local;
  
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(&this->
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              );
  this->allocator_ = allocator;
  this->ownAllocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  internal::Stack<rapidjson::CrtAllocator>::Stack(&this->stack_,stackAllocator,stackCapacity);
  ParseResult::ParseResult(&this->parseResult_);
  if (this->allocator_ == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    this_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
    MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
              (this_00,0x10000,(CrtAllocator *)0x0);
    this->allocator_ = this_00;
    this->ownAllocator_ = this_00;
  }
  return;
}

Assistant:

GenericDocument(Allocator* allocator = 0, size_t stackCapacity = kDefaultStackCapacity, StackAllocator* stackAllocator = 0) :
        allocator_(allocator), ownAllocator_(0), stack_(stackAllocator, stackCapacity), parseResult_()
    {
        if (!allocator_)
            ownAllocator_ = allocator_ = CEREAL_RAPIDJSON_NEW(Allocator)();
    }